

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O3

void test_AString_split_noDelimiter_fn(int _i)

{
  int iVar1;
  ASplittedString *splitted;
  char *pcVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *pcStack_68;
  char *pcStack_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator = private_ACUtilsTest_AString_realloc;
  string.deallocator = private_ACUtilsTest_AString_free;
  string.size = 8;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x14e7c5;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"01234567",9);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x14e7fc;
  splitted = AString_split(&string,';',false);
  if (string.capacity != 8) {
    pcStack_60 = "(8)";
    pcVar7 = "(string).capacity == (8)";
    pcVar8 = "(string).capacity";
    pcVar2 = (char *)string.capacity;
LAB_0014eb4f:
    iVar1 = 0x9f8;
LAB_0014edbf:
    local_58 = (char *)0x8;
LAB_0014edc5:
    uStack_50 = 0;
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar6 = &pcStack_60;
    goto LAB_0014edff;
  }
  uStack_50 = 0x14e81d;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9f8);
  if (string.buffer == (char *)0x0) {
    pcVar2 = "(void*) (string).buffer != NULL";
    pcVar7 = "(void*) (string).buffer";
    iVar1 = 0x9f8;
    goto LAB_0014ed2c;
  }
  uStack_50 = 0x14e83a;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9f8);
  pcVar4 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar2 = "";
    pcVar4 = "(null)";
  }
  else {
    uStack_50 = 0x14e85a;
    iVar1 = strcmp("01234567",string.buffer);
    if (iVar1 == 0) {
      uStack_50 = 0x14e873;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9f8);
      if (string.size != 8) {
        pcStack_60 = "strlen(\"01234567\")";
        pcVar7 = "(string).size == strlen(\"01234567\")";
        pcVar8 = "(string).size";
        pcVar2 = (char *)string.size;
        goto LAB_0014eb4f;
      }
      uStack_50 = 0x14e893;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9f8);
      if (splitted == (ASplittedString *)0x0) {
        pcVar2 = "(void*) splitted != NULL";
        pcVar7 = "(void*) splitted";
        iVar1 = 0x9f9;
LAB_0014ed2c:
        uStack_50 = 0;
        local_58 = (char *)0x0;
        pcStack_60 = (char *)0x14ed33;
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,iVar1,"Assertion \'_ck_x != NULL\' failed",
                          "Assertion \'%s\' failed: %s == %#x",pcVar2,pcVar7);
      }
      uStack_50 = 0x14e8ad;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9f9);
      uStack_50 = 0x14e8b5;
      pcVar2 = (char *)private_ACUtils_ADynArray_size(splitted);
      if (pcVar2 != (char *)0x1) {
        pcStack_60 = "1";
        pcVar7 = "private_ACUtils_ADynArray_size(splitted) == 1";
        pcVar8 = "private_ACUtils_ADynArray_size(splitted)";
        iVar1 = 0x9fa;
        local_58 = (char *)0x1;
        goto LAB_0014edc5;
      }
      uStack_50 = 0x14e8d0;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9fa);
      pcVar2 = (char *)(*splitted->buffer)->capacity;
      if (pcVar2 != (char *)0x8) {
        pcStack_60 = "(8)";
        pcVar7 = "(*(splitted->buffer[0])).capacity == (8)";
        pcVar8 = "(*(splitted->buffer[0])).capacity";
LAB_0014ecc0:
        iVar1 = 0x9fb;
        goto LAB_0014edbf;
      }
      uStack_50 = 0x14e8f6;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9fb);
      if ((*splitted->buffer)->buffer == (char *)0x0) {
        pcVar2 = "(void*) (*(splitted->buffer[0])).buffer != NULL";
        pcVar7 = "(void*) (*(splitted->buffer[0])).buffer";
        iVar1 = 0x9fb;
        goto LAB_0014ed2c;
      }
      uStack_50 = 0x14e919;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9fb);
      pcVar4 = (*splitted->buffer)->buffer;
      if (pcVar4 == (char *)0x0) {
        pcVar2 = "";
        pcVar4 = "(null)";
      }
      else {
        uStack_50 = 0x14e93f;
        iVar1 = strcmp("01234567",pcVar4);
        if (iVar1 == 0) {
          uStack_50 = 0x14e958;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9fb);
          pcVar2 = (char *)(*splitted->buffer)->size;
          if (pcVar2 != (char *)0x8) {
            pcStack_60 = "strlen(\"01234567\")";
            pcVar7 = "(*(splitted->buffer[0])).size == strlen(\"01234567\")";
            pcVar8 = "(*(splitted->buffer[0])).size";
            goto LAB_0014ecc0;
          }
          uStack_50 = 0x14e97e;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9fb);
          uStack_50 = 0x14e986;
          AString_freeSplitted(splitted);
          if (string.capacity != 8) {
            pcStack_60 = "(8)";
            pcVar7 = "(string).capacity == (8)";
            pcVar8 = "(string).capacity";
            pcVar2 = (char *)string.capacity;
LAB_0014edba:
            iVar1 = 0x9fd;
            goto LAB_0014edbf;
          }
          uStack_50 = 0x14e9a6;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9fd);
          if (string.buffer == (char *)0x0) {
            pcVar2 = "(void*) (string).buffer != NULL";
            pcVar7 = "(void*) (string).buffer";
            iVar1 = 0x9fd;
            goto LAB_0014ed2c;
          }
          uStack_50 = 0x14e9c3;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9fd);
          pcVar4 = string.buffer;
          if (string.buffer == (char *)0x0) {
            pcVar4 = "(null)";
            pcVar2 = "";
LAB_0014ed4a:
            expr = 
            "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
            ;
            pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
            pcVar7 = "(string).buffer == (\"01234567\")";
            pcVar8 = "(string).buffer";
            iVar1 = 0x9fd;
            local_58 = "\"";
            pcStack_60 = "01234567";
            pcStack_68 = "\"";
            pcStack_70 = "(\"01234567\")";
            ppcVar5 = &pcStack_78;
            pcStack_78 = pcVar2;
          }
          else {
            uStack_50 = 0x14e9e0;
            iVar1 = strcmp("01234567",string.buffer);
            if (iVar1 != 0) {
              pcVar2 = "\"";
              goto LAB_0014ed4a;
            }
            uStack_50 = 0x14e9f9;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9fd);
            if (string.size != 8) {
              pcStack_60 = "strlen(\"01234567\")";
              pcVar7 = "(string).size == strlen(\"01234567\")";
              pcVar8 = "(string).size";
              pcVar2 = (char *)string.size;
              goto LAB_0014edba;
            }
            uStack_50 = 0x14ea19;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9fd);
            if (private_ACUtilsTest_AString_reallocCount == private_ACUtilsTest_AString_freeCount) {
              uStack_50 = 0x14ea41;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9fe);
              uStack_50 = 0x14ea4a;
              (*string.deallocator)(string.buffer);
              return;
            }
            pcVar4 = "(private_ACUtilsTest_AString_freeCount)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar7 = 
            "private_ACUtilsTest_AString_reallocCount == (private_ACUtilsTest_AString_freeCount)";
            pcVar8 = "private_ACUtilsTest_AString_reallocCount";
            iVar1 = 0x9fe;
            ppcVar5 = &local_58;
            local_58 = (char *)private_ACUtilsTest_AString_freeCount;
            pcVar2 = (char *)private_ACUtilsTest_AString_reallocCount;
          }
          uStack_50 = 0;
          ppcVar6 = (char **)((long)ppcVar5 + -8);
          *(char **)((long)ppcVar5 + -8) = pcVar4;
          goto LAB_0014edff;
        }
        pcVar2 = "\"";
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar7 = "(*(splitted->buffer[0])).buffer == (\"01234567\")";
      pcVar8 = "(*(splitted->buffer[0])).buffer";
      iVar1 = 0x9fb;
      uStack_50 = 0;
      local_58 = "\"";
      pcStack_60 = "01234567";
      pcStack_68 = "\"";
      pcStack_70 = "(\"01234567\")";
      ppcVar6 = &pcStack_80;
      pcStack_80 = pcVar4;
      pcStack_78 = pcVar2;
      goto LAB_0014edff;
    }
    pcVar2 = "\"";
  }
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  pcVar7 = "(string).buffer == (\"01234567\")";
  pcVar8 = "(string).buffer";
  iVar1 = 0x9f8;
  uStack_50 = 0;
  local_58 = "\"";
  pcStack_60 = "01234567";
  pcStack_68 = "\"";
  pcStack_70 = "(\"01234567\")";
  ppcVar6 = &pcStack_80;
  pcStack_80 = pcVar4;
  pcStack_78 = pcVar2;
LAB_0014edff:
  *(char **)((long)ppcVar6 + -8) = pcVar2;
  *(code **)((long)ppcVar6 + -0x10) = test_AString_split_firstCharDelimiter_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar3,pcVar7,pcVar8);
}

Assistant:

static struct AString private_ACUtilsTest_AString_constructTestString(const char *initBuffer, size_t capacity)
{
    bool tmp = private_ACUtilsTest_AString_reallocFail;
    struct AString string = {private_ACUtilsTest_AString_realloc, private_ACUtilsTest_AString_free};
    string.size = strlen(initBuffer);
    string.capacity = capacity;
    private_ACUtilsTest_AString_reallocFail = false;
    string.buffer = (char*) string.reallocator(nullptr, string.capacity + 1);
    private_ACUtilsTest_AString_reallocFail = tmp;
    private_ACUtilsTest_AString_reallocCount = 0;
    private_ACUtilsTest_AString_freeCount = 0;
    memcpy(string.buffer, initBuffer, string.size + 1); /* +1 for '\0' */
    return string;
}